

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_AddIntrinsicPromise(JSContext *ctx)

{
  JSRuntime *rt_00;
  int64_t iVar1;
  JSValue proto;
  JSValue proto_00;
  JSValue v;
  JSValue v_00;
  JSValue obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue obj_04;
  JSValue obj_05;
  JSValue proto_01;
  JSValue proto_02;
  JSValue proto_03;
  JSValue proto_04;
  JSValue func_obj;
  JSValue func_obj_00;
  JSValue func_obj_01;
  JSValue func_obj_02;
  int iVar2;
  JSContext *in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  JSValue obj1;
  JSRuntime *rt;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar7;
  int in_stack_ffffffffffffff04;
  JSCFunctionEnum cproto;
  int length;
  JSContext *in_stack_ffffffffffffff10;
  JSContext *ctx_00;
  JSCFunction *in_stack_ffffffffffffff18;
  JSValue *pJVar8;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar9;
  int in_stack_ffffffffffffff24;
  int iVar10;
  char *in_stack_ffffffffffffff28;
  JSValue *pJVar11;
  JSContext *in_stack_ffffffffffffff30;
  JSContext *ctx_01;
  JSValueUnion in_stack_ffffffffffffff38;
  JSValueUnion func;
  JSContext *in_stack_ffffffffffffff40;
  JSValueUnion JVar12;
  JSValueUnion in_stack_ffffffffffffff48;
  JSValueUnion JVar13;
  int64_t in_stack_ffffffffffffff50;
  JSValueUnion JVar14;
  int64_t local_a8;
  int iVar15;
  int ctor_flags;
  JSValue in_stack_ffffffffffffff60;
  JSValueUnion local_90;
  int64_t local_88;
  JSValueUnion local_80;
  int64_t local_78;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_50;
  int64_t local_48;
  JSValueUnion local_30;
  int64_t local_28;
  
  rt_00 = in_RDI->rt;
  iVar2 = JS_IsRegisteredClass(rt_00,0x2a);
  if (iVar2 == 0) {
    init_class_range((JSRuntime *)in_stack_ffffffffffffff38.ptr,
                     (JSClassShortDef *)in_stack_ffffffffffffff30,
                     (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28)
    ;
    rt_00->class_array[0x2b].call = js_promise_resolve_function_call;
    rt_00->class_array[0x2c].call = js_promise_resolve_function_call;
    rt_00->class_array[0x2d].call = js_async_function_call;
    rt_00->class_array[0x2e].call = js_async_function_resolve_call;
    rt_00->class_array[0x2f].call = js_async_function_resolve_call;
    rt_00->class_array[0x31].call = js_async_generator_function_call;
  }
  cproto = (JSCFunctionEnum)in_RDI->class_proto;
  length = (int)((ulong)in_RDI->class_proto >> 0x20);
  JVar3 = JS_NewObject((JSContext *)0x1200a6);
  local_30 = JVar3.u;
  *(JSValueUnion *)(CONCAT44(length,cproto) + 0x2a0) = local_30;
  local_28 = JVar3.tag;
  *(int64_t *)(CONCAT44(length,cproto) + 0x2a8) = local_28;
  obj.tag._0_4_ = in_stack_ffffffffffffff20;
  obj.u.ptr = in_stack_ffffffffffffff18;
  obj.tag._4_4_ = in_stack_ffffffffffffff24;
  JS_SetPropertyFunctionList
            (in_stack_ffffffffffffff10,obj,(JSCFunctionListEntry *)CONCAT44(length,cproto),
             in_stack_ffffffffffffff04);
  JVar3 = JS_NewCFunction2((JSContext *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10,length,cproto
                           ,in_stack_ffffffffffffff04);
  ctx_00 = in_RDI;
  JVar3 = JS_DupValue(in_RDI,JVar3);
  local_50 = JVar3.u;
  (ctx_00->promise_ctor).u = local_50;
  local_48 = JVar3.tag;
  (ctx_00->promise_ctor).tag = local_48;
  obj_00.tag._0_4_ = in_stack_ffffffffffffff20;
  obj_00.u.ptr = in_stack_ffffffffffffff18;
  obj_00.tag._4_4_ = in_stack_ffffffffffffff24;
  JS_SetPropertyFunctionList
            (ctx_00,obj_00,(JSCFunctionListEntry *)CONCAT44(length,cproto),in_stack_ffffffffffffff04
            );
  func_obj.tag = in_stack_ffffffffffffff50;
  func_obj.u.ptr = in_stack_ffffffffffffff48.ptr;
  proto_01.tag = (int64_t)in_stack_ffffffffffffff40;
  proto_01.u.ptr = in_stack_ffffffffffffff38.ptr;
  JS_NewGlobalCConstructor2(in_stack_ffffffffffffff30,func_obj,in_stack_ffffffffffffff28,proto_01);
  pJVar8 = in_RDI->class_proto;
  JVar3.u._4_4_ = in_stack_fffffffffffffefc;
  JVar3.u.int32 = in_stack_fffffffffffffef8;
  JVar3.tag._0_4_ = in_stack_ffffffffffffff00;
  JVar3.tag._4_4_ = in_stack_ffffffffffffff04;
  JVar3 = JS_NewObjectProto((JSContext *)0x12025f,JVar3);
  local_60 = JVar3.u;
  pJVar8[0x2d].u = local_60;
  local_58 = JVar3.tag;
  pJVar8[0x2d].tag = local_58;
  uVar6 = SUB84((in_RDI->function_ctor).u,4);
  iVar1 = (in_RDI->function_ctor).tag;
  uVar7 = (undefined4)iVar1;
  iVar2 = (int)((ulong)iVar1 >> 0x20);
  JS_NewCFunction3(in_stack_ffffffffffffff40,(JSCFunction *)in_stack_ffffffffffffff38.ptr,
                   (char *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20)
                   ,(JSCFunctionEnum)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                   in_stack_ffffffffffffff60);
  iVar15 = in_stack_ffffffffffffff60.u._0_4_;
  iVar10 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  obj_01.tag._0_4_ = in_stack_ffffffffffffff20;
  obj_01.u.ptr = pJVar8;
  obj_01.tag._4_4_ = in_stack_ffffffffffffff24;
  JS_SetPropertyFunctionList(ctx_00,obj_01,(JSCFunctionListEntry *)CONCAT44(length,cproto),iVar2);
  uVar5 = 1;
  func_obj_00.tag = in_stack_ffffffffffffff50;
  func_obj_00.u.float64 = in_stack_ffffffffffffff48.float64;
  proto_02.tag = (int64_t)in_stack_ffffffffffffff40;
  proto_02.u.ptr = in_stack_ffffffffffffff38.ptr;
  JS_SetConstructor2(in_stack_ffffffffffffff30,func_obj_00,proto_02,iVar10,iVar15);
  v.u._4_4_ = length;
  v.u.int32 = cproto;
  v.tag = (int64_t)ctx_00;
  JS_FreeValue((JSContext *)CONCAT44(iVar2,uVar7),v);
  uVar9 = SUB84(in_RDI,0);
  iVar10 = (int)((ulong)in_RDI >> 0x20);
  JVar3 = JS_NewObject((JSContext *)0x1203b9);
  local_80 = JVar3.u;
  *(JSValueUnion *)(CONCAT44(iVar10,uVar9) + 0x128) = local_80;
  local_78 = JVar3.tag;
  *(int64_t *)(CONCAT44(iVar10,uVar9) + 0x130) = local_78;
  obj_02.tag._0_4_ = uVar9;
  obj_02.u.ptr = pJVar8;
  obj_02.tag._4_4_ = iVar10;
  JS_SetPropertyFunctionList(ctx_00,obj_02,(JSCFunctionListEntry *)CONCAT44(length,cproto),iVar2);
  pJVar11 = in_RDI->class_proto;
  JVar4.u._4_4_ = uVar6;
  JVar4.u.int32 = uVar5;
  JVar4.tag._0_4_ = uVar7;
  JVar4.tag._4_4_ = iVar2;
  JVar3 = JS_NewObjectProto((JSContext *)0x120453,JVar4);
  local_90 = JVar3.u;
  pJVar11[0x30].u = local_90;
  local_88 = JVar3.tag;
  pJVar11[0x30].tag = local_88;
  obj_03.tag._0_4_ = uVar9;
  obj_03.u.ptr = pJVar8;
  obj_03.tag._4_4_ = iVar10;
  JS_SetPropertyFunctionList(ctx_00,obj_03,(JSCFunctionListEntry *)CONCAT44(length,cproto),iVar2);
  ctx_01 = (JSContext *)in_RDI->class_proto;
  proto.u._4_4_ = uVar6;
  proto.u.int32 = uVar5;
  proto.tag._0_4_ = uVar7;
  proto.tag._4_4_ = iVar2;
  JVar3 = JS_NewObjectProto((JSContext *)0x1204eb,proto);
  ctx_01[1].eval_obj.tag = (int64_t)JVar3.u;
  ctx_01[1].global_obj.u = (JSValueUnion)JVar3.tag;
  obj_04.tag._0_4_ = uVar9;
  obj_04.u.ptr = pJVar8;
  obj_04.tag._4_4_ = iVar10;
  JS_SetPropertyFunctionList(ctx_00,obj_04,(JSCFunctionListEntry *)CONCAT44(length,cproto),iVar2);
  func = (JSValueUnion)in_RDI->class_proto;
  proto_00.u._4_4_ = uVar6;
  proto_00.u.int32 = uVar5;
  proto_00.tag._0_4_ = uVar7;
  proto_00.tag._4_4_ = iVar2;
  JVar4 = JS_NewObjectProto((JSContext *)0x120577,proto_00);
  JVar14 = JVar4.u;
  local_a8 = JVar4.tag;
  ((JSValueUnion *)((long)func.ptr + 0x310))->ptr = (void *)JVar14;
  *(int64_t *)((long)func.ptr + 0x318) = local_a8;
  iVar1 = (in_RDI->function_ctor).tag;
  uVar5 = (undefined4)iVar1;
  iVar2 = (int)((ulong)iVar1 >> 0x20);
  JVar4 = JS_NewCFunction3(in_stack_ffffffffffffff40,(JSCFunction *)func.ptr,(char *)ctx_01,
                           (int)((ulong)pJVar11 >> 0x20),(JSCFunctionEnum)pJVar11,iVar10,JVar3);
  ctor_flags = JVar3.u._0_4_;
  iVar15 = (int)((ulong)pJVar11 >> 0x20);
  JVar12 = JVar4.u;
  JVar13 = (JSValueUnion)JVar4.tag;
  obj_05.tag._0_4_ = uVar9;
  obj_05.u.ptr = pJVar8;
  obj_05.tag._4_4_ = iVar10;
  JS_SetPropertyFunctionList(ctx_00,obj_05,(JSCFunctionListEntry *)CONCAT44(length,cproto),iVar2);
  func_obj_01.tag = (int64_t)JVar14.ptr;
  func_obj_01.u.ptr = JVar13.ptr;
  proto_03.tag = (int64_t)JVar12.ptr;
  proto_03.u.ptr = func.ptr;
  JS_SetConstructor2(ctx_01,func_obj_01,proto_03,iVar15,ctor_flags);
  func_obj_02.tag = (int64_t)JVar14.ptr;
  func_obj_02.u.ptr = JVar13.ptr;
  proto_04.tag = (int64_t)JVar12.ptr;
  proto_04.u.ptr = func.ptr;
  JS_SetConstructor2(ctx_01,func_obj_02,proto_04,iVar15,ctor_flags);
  v_00.u._4_4_ = length;
  v_00.u.int32 = cproto;
  v_00.tag = (int64_t)ctx_00;
  JS_FreeValue((JSContext *)CONCAT44(iVar2,uVar5),v_00);
  return;
}

Assistant:

void JS_AddIntrinsicPromise(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    JSValue obj1;

    if (!JS_IsRegisteredClass(rt, JS_CLASS_PROMISE)) {
        init_class_range(rt, js_async_class_def, JS_CLASS_PROMISE,
                         countof(js_async_class_def));
        rt->class_array[JS_CLASS_PROMISE_RESOLVE_FUNCTION].call = js_promise_resolve_function_call;
        rt->class_array[JS_CLASS_PROMISE_REJECT_FUNCTION].call = js_promise_resolve_function_call;
        rt->class_array[JS_CLASS_ASYNC_FUNCTION].call = js_async_function_call;
        rt->class_array[JS_CLASS_ASYNC_FUNCTION_RESOLVE].call = js_async_function_resolve_call;
        rt->class_array[JS_CLASS_ASYNC_FUNCTION_REJECT].call = js_async_function_resolve_call;
        rt->class_array[JS_CLASS_ASYNC_GENERATOR_FUNCTION].call = js_async_generator_function_call;
    }

    /* Promise */
    ctx->class_proto[JS_CLASS_PROMISE] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_PROMISE],
                               js_promise_proto_funcs,
                               countof(js_promise_proto_funcs));
    obj1 = JS_NewCFunction2(ctx, js_promise_constructor, "Promise", 1,
                            JS_CFUNC_constructor, 0);
    ctx->promise_ctor = JS_DupValue(ctx, obj1);
    JS_SetPropertyFunctionList(ctx, obj1,
                               js_promise_funcs,
                               countof(js_promise_funcs));
    JS_NewGlobalCConstructor2(ctx, obj1, "Promise",
                              ctx->class_proto[JS_CLASS_PROMISE]);

    /* AsyncFunction */
    ctx->class_proto[JS_CLASS_ASYNC_FUNCTION] = JS_NewObjectProto(ctx, ctx->function_proto);
    obj1 = JS_NewCFunction3(ctx, (JSCFunction *)js_function_constructor,
                            "AsyncFunction", 1,
                            JS_CFUNC_constructor_or_func_magic, JS_FUNC_ASYNC,
                            ctx->function_ctor);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_ASYNC_FUNCTION],
                               js_async_function_proto_funcs,
                               countof(js_async_function_proto_funcs));
    JS_SetConstructor2(ctx, obj1, ctx->class_proto[JS_CLASS_ASYNC_FUNCTION],
                       0, JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);

    /* AsyncIteratorPrototype */
    ctx->async_iterator_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->async_iterator_proto,
                               js_async_iterator_proto_funcs,
                               countof(js_async_iterator_proto_funcs));

    /* AsyncFromSyncIteratorPrototype */
    ctx->class_proto[JS_CLASS_ASYNC_FROM_SYNC_ITERATOR] =
        JS_NewObjectProto(ctx, ctx->async_iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ASYNC_FROM_SYNC_ITERATOR],
                               js_async_from_sync_iterator_proto_funcs,
                               countof(js_async_from_sync_iterator_proto_funcs));

    /* AsyncGeneratorPrototype */
    ctx->class_proto[JS_CLASS_ASYNC_GENERATOR] =
        JS_NewObjectProto(ctx, ctx->async_iterator_proto);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_ASYNC_GENERATOR],
                               js_async_generator_proto_funcs,
                               countof(js_async_generator_proto_funcs));

    /* AsyncGeneratorFunction */
    ctx->class_proto[JS_CLASS_ASYNC_GENERATOR_FUNCTION] =
        JS_NewObjectProto(ctx, ctx->function_proto);
    obj1 = JS_NewCFunction3(ctx, (JSCFunction *)js_function_constructor,
                            "AsyncGeneratorFunction", 1,
                            JS_CFUNC_constructor_or_func_magic,
                            JS_FUNC_ASYNC_GENERATOR,
                            ctx->function_ctor);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_ASYNC_GENERATOR_FUNCTION],
                               js_async_generator_function_proto_funcs,
                               countof(js_async_generator_function_proto_funcs));
    JS_SetConstructor2(ctx, ctx->class_proto[JS_CLASS_ASYNC_GENERATOR_FUNCTION],
                       ctx->class_proto[JS_CLASS_ASYNC_GENERATOR],
                       JS_PROP_CONFIGURABLE, JS_PROP_CONFIGURABLE);
    JS_SetConstructor2(ctx, obj1, ctx->class_proto[JS_CLASS_ASYNC_GENERATOR_FUNCTION],
                       0, JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);
}